

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_12_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  float *data;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int k_count;
  int iVar43;
  ulong uVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  float *pfVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  long lVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  float *pfVar68;
  float *pfVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  int iVar74;
  long lVar75;
  int iVar76;
  bool bVar77;
  byte bVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [12];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar125 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  int data_width;
  float local_c8;
  
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  auVar119 = ZEXT1664(auVar86);
  auVar87._8_4_ = 0x3effffff;
  auVar87._0_8_ = 0x3effffff3effffff;
  auVar87._12_4_ = 0x3effffff;
  auVar123 = ZEXT1664(auVar87);
  fVar94 = ipoint->scale;
  auVar128 = ZEXT464((uint)fVar94);
  auVar79 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)fVar94),auVar86,0xf8);
  auVar79 = ZEXT416((uint)(fVar94 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  iVar21 = (int)auVar79._0_4_;
  fVar92 = -0.08 / (fVar94 * fVar94);
  auVar80 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)ipoint->x),auVar86,0xf8);
  auVar80 = ZEXT416((uint)(ipoint->x + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81._0_8_ = (double)auVar80._0_4_;
  auVar81._8_8_ = auVar80._8_8_;
  auVar85._0_8_ = (double)fVar94;
  auVar85._8_8_ = 0;
  auVar80 = vfmadd231sd_fma(auVar81,auVar85,ZEXT816(0x3fe0000000000000));
  auVar84._0_4_ = (float)auVar80._0_8_;
  auVar84._4_12_ = auVar80._4_12_;
  auVar80 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)ipoint->y),auVar86,0xf8);
  auVar80 = ZEXT416((uint)(ipoint->y + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar82._0_8_ = (double)auVar80._0_4_;
  auVar82._8_8_ = auVar80._8_8_;
  auVar80 = vfmadd231sd_fma(auVar82,auVar85,ZEXT816(0x3fe0000000000000));
  auVar83._0_4_ = (float)auVar80._0_8_;
  auVar83._4_12_ = auVar80._4_12_;
  auVar80._0_4_ = (int)auVar79._0_4_;
  auVar80._4_4_ = (int)auVar79._4_4_;
  auVar80._8_4_ = (int)auVar79._8_4_;
  auVar80._12_4_ = (int)auVar79._12_4_;
  auVar79 = vcvtdq2ps_avx(auVar80);
  fVar2 = auVar84._0_4_ - auVar79._0_4_;
  auVar81 = ZEXT416((uint)fVar2);
  fVar3 = auVar83._0_4_ - auVar79._0_4_;
  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar94),auVar84);
  auVar80 = vpternlogd_avx512vl(auVar87,auVar79,auVar86,0xf8);
  auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  if (iVar21 < (int)auVar79._0_4_) {
    auVar82 = ZEXT416((uint)fVar94);
    auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar82,auVar83);
    auVar88._8_4_ = 0x3effffff;
    auVar88._0_8_ = 0x3effffff3effffff;
    auVar88._12_4_ = 0x3effffff;
    auVar89._8_4_ = 0x80000000;
    auVar89._0_8_ = 0x8000000080000000;
    auVar89._12_4_ = 0x80000000;
    auVar80 = vpternlogd_avx512vl(auVar89,auVar79,auVar88,0xea);
    auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
    auVar79 = vroundss_avx(auVar79,auVar79,0xb);
    if (iVar21 < (int)auVar79._0_4_) {
      auVar79 = vfmadd231ss_fma(auVar84,auVar82,ZEXT416(0x41300000));
      auVar90._8_4_ = 0x80000000;
      auVar90._0_8_ = 0x8000000080000000;
      auVar90._12_4_ = 0x80000000;
      auVar80 = vpternlogd_avx512vl(auVar90,auVar79,auVar88,0xea);
      auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
      auVar79 = vroundss_avx(auVar79,auVar79,0xb);
      if ((int)auVar79._0_4_ + iVar21 <= iimage->width) {
        auVar79 = vfmadd231ss_fma(auVar83,auVar82,ZEXT416(0x41300000));
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar80 = vpternlogd_avx512vl(auVar88,auVar79,auVar11,0xf8);
        auVar79 = ZEXT416((uint)(auVar79._0_4_ + auVar80._0_4_));
        auVar79 = vroundss_avx(auVar79,auVar79,0xb);
        if ((int)auVar79._0_4_ + iVar21 <= iimage->height) {
          fVar2 = fVar2 + 0.5;
          pfVar68 = iimage->data;
          iVar1 = iimage->data_width;
          iVar43 = iVar21 * 2;
          pfVar69 = haarResponseY + 0x23;
          pfVar59 = haarResponseX + 0x23;
          uVar34 = 0xfffffff4;
          do {
            auVar79._0_4_ = (float)(int)uVar34;
            auVar79._4_12_ = in_ZMM8._4_12_;
            auVar79 = vfmadd213ss_fma(auVar79,auVar82,ZEXT416((uint)(fVar3 + 0.5)));
            iVar16 = (int)auVar79._0_4_;
            auVar106._0_4_ = (float)(int)(uVar34 | 1);
            auVar106._4_12_ = in_ZMM8._4_12_;
            auVar79 = vfmadd213ss_fma(auVar106,auVar82,ZEXT416((uint)(fVar3 + 0.5)));
            iVar18 = (int)auVar79._0_4_;
            iVar17 = (iVar16 + -1) * iVar1;
            iVar15 = (iVar16 + -1 + iVar21) * iVar1;
            iVar19 = (iVar16 + -1 + iVar43) * iVar1;
            iVar20 = (iVar18 + -1) * iVar1;
            iVar16 = (iVar18 + -1 + iVar21) * iVar1;
            iVar18 = (iVar18 + -1 + iVar43) * iVar1;
            lVar41 = 0;
            do {
              iVar72 = (int)lVar41;
              auVar107._0_4_ = (float)(iVar72 + -0xc);
              auVar107._4_12_ = in_ZMM8._4_12_;
              auVar79 = vfmadd213ss_fma(auVar107,auVar82,ZEXT416((uint)fVar2));
              iVar26 = (int)auVar79._0_4_;
              auVar108._0_4_ = (float)(iVar72 + -0xb);
              auVar122._4_12_ = auVar123._4_12_;
              auVar108._4_12_ = auVar122._4_12_;
              auVar79 = vfmadd213ss_fma(auVar108,auVar82,ZEXT416((uint)fVar2));
              iVar74 = (int)auVar79._0_4_;
              auVar109._0_4_ = (float)(iVar72 + -10);
              auVar109._4_12_ = auVar122._4_12_;
              auVar80 = ZEXT416((uint)fVar2);
              auVar79 = vfmadd213ss_fma(auVar109,auVar82,auVar80);
              iVar37 = (int)auVar79._0_4_;
              auVar110._0_4_ = (float)(iVar72 + -9);
              auVar110._4_12_ = auVar122._4_12_;
              auVar79 = vfmadd213ss_fma(auVar110,auVar82,auVar80);
              iVar22 = (int)auVar79._0_4_;
              auVar111._0_4_ = (float)(iVar72 + -8);
              auVar111._4_12_ = auVar122._4_12_;
              auVar79 = vfmadd213ss_fma(auVar111,auVar82,auVar80);
              iVar23 = (int)auVar79._0_4_;
              auVar125._0_4_ = (float)(iVar72 + -7);
              auVar125._4_12_ = auVar122._4_12_;
              auVar124._0_4_ = (float)(iVar72 + -6);
              auVar124._4_12_ = auVar122._4_12_;
              auVar122._0_4_ = (float)(iVar72 + -5);
              auVar118._0_4_ = (float)(iVar72 + -4);
              auVar120 = in_ZMM10._4_12_;
              auVar118._4_12_ = auVar120;
              auVar117._0_4_ = (float)(iVar72 + -3);
              auVar117._4_12_ = auVar120;
              auVar114._0_4_ = (float)(iVar72 + -2);
              auVar114._4_12_ = auVar120;
              auVar112._0_4_ = (float)(iVar72 + -1);
              auVar112._4_12_ = auVar120;
              iVar58 = iVar26 + -1 + iVar21;
              iVar65 = iVar26 + -1 + iVar43;
              fVar93 = pfVar68[iVar15 + -1 + iVar26];
              fVar99 = pfVar68[iVar19 + -1 + iVar26];
              fVar103 = pfVar68[iVar19 + iVar65];
              fVar115 = pfVar68[iVar17 + -1 + iVar26];
              fVar100 = pfVar68[iVar17 + iVar65];
              auVar83 = SUB6416(ZEXT464(0x40000000),0);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar58] -
                                                      pfVar68[iVar19 + iVar58])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar15 + iVar65];
              pfVar59[lVar41 + -0x23] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -0x23] = auVar79._0_4_ - (fVar99 - fVar100);
              iVar60 = iVar74 + -1 + iVar21;
              iVar66 = iVar74 + -1 + iVar43;
              fVar93 = pfVar68[iVar15 + -1 + iVar74];
              fVar99 = pfVar68[iVar19 + -1 + iVar74];
              fVar103 = pfVar68[iVar19 + iVar66];
              fVar115 = pfVar68[iVar17 + -1 + iVar74];
              fVar100 = pfVar68[iVar17 + iVar66];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar60] -
                                                      pfVar68[iVar19 + iVar60])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar15 + iVar66];
              pfVar59[lVar41 + -0x22] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              iVar61 = iVar37 + -1 + iVar21;
              iVar76 = iVar37 + -1 + iVar43;
              pfVar69[lVar41 + -0x22] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar15 + -1 + iVar37];
              fVar99 = pfVar68[iVar19 + -1 + iVar37];
              fVar103 = pfVar68[iVar19 + iVar76];
              fVar115 = pfVar68[iVar17 + -1 + iVar37];
              fVar100 = pfVar68[iVar17 + iVar76];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar61] -
                                                      pfVar68[iVar19 + iVar61])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar15 + iVar76];
              pfVar59[lVar41 + -0x21] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -0x21] = auVar79._0_4_ - (fVar99 - fVar100);
              iVar62 = iVar22 + -1 + iVar21;
              iVar67 = iVar22 + -1 + iVar43;
              fVar93 = pfVar68[iVar15 + -1 + iVar22];
              fVar99 = pfVar68[iVar19 + -1 + iVar22];
              fVar103 = pfVar68[iVar19 + iVar67];
              fVar115 = pfVar68[iVar17 + -1 + iVar22];
              fVar100 = pfVar68[iVar17 + iVar67];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar62] -
                                                      pfVar68[iVar19 + iVar62])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar15 + iVar67];
              pfVar59[lVar41 + -0x20] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              iVar27 = iVar23 + -1 + iVar21;
              pfVar69[lVar41 + -0x20] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar15 + -1 + iVar23];
              fVar99 = pfVar68[iVar19 + -1 + iVar23];
              iVar45 = iVar23 + -1 + iVar43;
              fVar103 = pfVar68[iVar19 + iVar45];
              fVar115 = pfVar68[iVar17 + -1 + iVar23];
              fVar100 = pfVar68[iVar17 + iVar45];
              fVar4 = pfVar68[iVar15 + iVar45];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar27] -
                                                      pfVar68[iVar19 + iVar27])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0x1f] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar125,auVar82,auVar80);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -0x1f] = auVar80._0_4_ - (fVar99 - fVar100);
              iVar46 = (int)auVar79._0_4_;
              iVar28 = iVar46 + -1 + iVar21;
              fVar93 = pfVar68[iVar15 + -1 + iVar46];
              fVar99 = pfVar68[iVar19 + -1 + iVar46];
              iVar29 = iVar46 + -1 + iVar43;
              fVar103 = pfVar68[iVar19 + iVar29];
              fVar115 = pfVar68[iVar17 + -1 + iVar46];
              fVar100 = pfVar68[iVar17 + iVar29];
              fVar4 = pfVar68[iVar15 + iVar29];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar28] -
                                                      pfVar68[iVar19 + iVar28])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0x1e] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar81 = ZEXT416((uint)fVar2);
              auVar79 = vfmadd213ss_fma(auVar124,auVar82,auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              iVar47 = (int)auVar79._0_4_;
              pfVar69[lVar41 + -0x1e] = auVar80._0_4_ - (fVar99 - fVar100);
              iVar30 = iVar47 + -1 + iVar21;
              fVar93 = pfVar68[iVar15 + -1 + iVar47];
              fVar99 = pfVar68[iVar19 + -1 + iVar47];
              iVar31 = iVar47 + -1 + iVar43;
              fVar103 = pfVar68[iVar19 + iVar31];
              fVar115 = pfVar68[iVar17 + -1 + iVar47];
              fVar100 = pfVar68[iVar17 + iVar31];
              fVar4 = pfVar68[iVar15 + iVar31];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar30] -
                                                      pfVar68[iVar19 + iVar30])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0x1d] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar122,auVar82,auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              iVar48 = (int)auVar79._0_4_;
              iVar32 = iVar48 + -1 + iVar21;
              pfVar69[lVar41 + -0x1d] = auVar80._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar15 + -1 + iVar48];
              fVar99 = pfVar68[iVar19 + -1 + iVar48];
              iVar63 = iVar48 + -1 + iVar43;
              fVar100 = pfVar68[iVar19 + iVar63] - pfVar68[iVar17 + -1 + iVar48];
              in_ZMM10 = ZEXT464((uint)fVar100);
              fVar103 = pfVar68[iVar17 + iVar63];
              fVar115 = pfVar68[iVar15 + iVar63];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar32] -
                                                      pfVar68[iVar19 + iVar32])),auVar83,
                                        ZEXT416((uint)fVar100));
              pfVar59[lVar41 + -0x1c] = (fVar99 - fVar103) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar118,auVar82,auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar115)),auVar83,
                                        ZEXT416((uint)fVar100));
              pfVar69[lVar41 + -0x1c] = auVar80._0_4_ - (fVar99 - fVar103);
              iVar49 = (int)auVar79._0_4_;
              iVar33 = iVar49 + -1 + iVar21;
              fVar93 = pfVar68[iVar15 + -1 + iVar49];
              fVar99 = pfVar68[iVar19 + -1 + iVar49];
              iVar24 = iVar49 + -1 + iVar43;
              fVar103 = pfVar68[iVar19 + iVar24];
              fVar115 = pfVar68[iVar17 + -1 + iVar49];
              fVar100 = pfVar68[iVar17 + iVar24];
              fVar4 = pfVar68[iVar15 + iVar24];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar33] -
                                                      pfVar68[iVar19 + iVar33])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0x1b] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar117,auVar82,auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              iVar50 = (int)auVar79._0_4_;
              pfVar69[lVar41 + -0x1b] = auVar80._0_4_ - (fVar99 - fVar100);
              iVar56 = iVar50 + -1 + iVar21;
              fVar93 = pfVar68[iVar15 + -1 + iVar50];
              fVar99 = pfVar68[iVar19 + -1 + iVar50];
              iVar25 = iVar50 + -1 + iVar43;
              fVar100 = pfVar68[iVar19 + iVar25] - pfVar68[iVar17 + -1 + iVar50];
              in_ZMM8 = ZEXT464((uint)fVar100);
              fVar103 = pfVar68[iVar17 + iVar25];
              fVar115 = pfVar68[iVar15 + iVar25];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar56] -
                                                      pfVar68[iVar19 + iVar56])),auVar83,
                                        ZEXT416((uint)fVar100));
              pfVar59[lVar41 + -0x1a] = (fVar99 - fVar103) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar114,auVar82,auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar115)),auVar83,
                                        ZEXT416((uint)fVar100));
              iVar51 = (int)auVar79._0_4_;
              iVar55 = iVar51 + -1 + iVar21;
              pfVar69[lVar41 + -0x1a] = auVar80._0_4_ - (fVar99 - fVar103);
              fVar93 = pfVar68[iVar15 + -1 + iVar51];
              fVar99 = pfVar68[iVar19 + -1 + iVar51];
              iVar54 = iVar51 + -1 + iVar43;
              fVar100 = pfVar68[iVar19 + iVar54] - pfVar68[iVar17 + -1 + iVar51];
              auVar123 = ZEXT464((uint)fVar100);
              fVar103 = pfVar68[iVar17 + iVar54];
              fVar115 = pfVar68[iVar15 + iVar54];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar55] -
                                                      pfVar68[iVar19 + iVar55])),auVar83,
                                        ZEXT416((uint)fVar100));
              pfVar59[lVar41 + -0x19] = (fVar99 - fVar103) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(auVar112,ZEXT416((uint)fVar94),auVar81);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar115)),auVar83,
                                        ZEXT416((uint)fVar100));
              pfVar69[lVar41 + -0x19] = auVar80._0_4_ - (fVar99 - fVar103);
              iVar52 = (int)auVar79._0_4_;
              iVar53 = iVar52 + -1 + iVar21;
              fVar93 = pfVar68[iVar15 + -1 + iVar52];
              fVar99 = pfVar68[iVar19 + -1 + iVar52];
              iVar38 = iVar52 + -1 + iVar43;
              fVar103 = pfVar68[iVar19 + iVar38];
              fVar115 = pfVar68[iVar17 + -1 + iVar52];
              fVar100 = pfVar68[iVar17 + iVar38];
              fVar4 = pfVar68[iVar15 + iVar38];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar17 + iVar53] -
                                                      pfVar68[iVar19 + iVar53])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0x18] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -0x18] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar26];
              fVar99 = pfVar68[iVar18 + -1 + iVar26];
              fVar103 = pfVar68[iVar65 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar26];
              fVar100 = pfVar68[iVar20 + iVar65];
              fVar4 = pfVar68[iVar16 + iVar65];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar58] -
                                                      pfVar68[iVar58 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -0xb] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -0xb] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar74];
              fVar99 = pfVar68[iVar18 + -1 + iVar74];
              fVar103 = pfVar68[iVar66 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar74];
              fVar100 = pfVar68[iVar20 + iVar66];
              fVar4 = pfVar68[iVar16 + iVar66];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar60] -
                                                      pfVar68[iVar60 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -10] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -10] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar37];
              fVar99 = pfVar68[iVar18 + -1 + iVar37];
              fVar103 = pfVar68[iVar76 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar37];
              fVar100 = pfVar68[iVar20 + iVar76];
              fVar4 = pfVar68[iVar16 + iVar76];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar61] -
                                                      pfVar68[iVar61 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -9] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -9] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar22];
              fVar99 = pfVar68[iVar18 + -1 + iVar22];
              fVar103 = pfVar68[iVar67 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar22];
              fVar100 = pfVar68[iVar20 + iVar67];
              fVar4 = pfVar68[iVar16 + iVar67];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar62] -
                                                      pfVar68[iVar62 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -8] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -8] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar23];
              fVar99 = pfVar68[iVar18 + -1 + iVar23];
              fVar103 = pfVar68[iVar45 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar23];
              fVar100 = pfVar68[iVar20 + iVar45];
              fVar4 = pfVar68[iVar16 + iVar45];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar27] -
                                                      pfVar68[iVar27 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -7] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -7] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar46];
              fVar99 = pfVar68[iVar18 + -1 + iVar46];
              fVar103 = pfVar68[iVar29 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar46];
              fVar100 = pfVar68[iVar20 + iVar29];
              fVar4 = pfVar68[iVar16 + iVar29];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar28] -
                                                      pfVar68[iVar28 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -6] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -6] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar47];
              fVar99 = pfVar68[iVar18 + -1 + iVar47];
              fVar103 = pfVar68[iVar31 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar47];
              fVar100 = pfVar68[iVar20 + iVar31];
              fVar4 = pfVar68[iVar16 + iVar31];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar30] -
                                                      pfVar68[iVar30 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41 + -5] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -5] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar48];
              fVar99 = pfVar68[iVar18 + -1 + iVar48];
              fVar103 = pfVar68[iVar63 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar48];
              fVar100 = pfVar68[iVar20 + iVar63];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar32] -
                                                      pfVar68[iVar32 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar16 + iVar63];
              pfVar59[lVar41 + -4] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -4] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar49];
              fVar99 = pfVar68[iVar18 + -1 + iVar49];
              fVar103 = pfVar68[iVar24 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar49];
              fVar100 = pfVar68[iVar20 + iVar24];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar33] -
                                                      pfVar68[iVar33 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar16 + iVar24];
              pfVar59[lVar41 + -3] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -3] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar50];
              fVar99 = pfVar68[iVar18 + -1 + iVar50];
              fVar103 = pfVar68[iVar25 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar50];
              fVar100 = pfVar68[iVar20 + iVar25];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar56] -
                                                      pfVar68[iVar56 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar16 + iVar25];
              pfVar59[lVar41 + -2] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -2] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar51];
              fVar99 = pfVar68[iVar18 + -1 + iVar51];
              fVar103 = pfVar68[iVar54 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar51];
              fVar100 = pfVar68[iVar20 + iVar54];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar55] -
                                                      pfVar68[iVar55 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              fVar4 = pfVar68[iVar16 + iVar54];
              pfVar59[lVar41 + -1] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41 + -1] = auVar79._0_4_ - (fVar99 - fVar100);
              fVar93 = pfVar68[iVar16 + -1 + iVar52];
              fVar99 = pfVar68[iVar18 + -1 + iVar52];
              fVar103 = pfVar68[iVar38 + iVar18];
              fVar115 = pfVar68[iVar20 + -1 + iVar52];
              fVar100 = pfVar68[iVar20 + iVar38];
              fVar4 = pfVar68[iVar16 + iVar38];
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar68[iVar20 + iVar53] -
                                                      pfVar68[iVar53 + iVar18])),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar59[lVar41] = (fVar99 - fVar100) + auVar79._0_4_;
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),auVar83,
                                        ZEXT416((uint)(fVar103 - fVar115)));
              pfVar69[lVar41] = auVar79._0_4_ - (fVar99 - fVar100);
              lVar41 = lVar41 + 0xc;
            } while (iVar72 + -0xc < 0);
            pfVar69 = pfVar69 + 0x30;
            pfVar59 = pfVar59 + 0x30;
            bVar77 = (int)uVar34 < 10;
            uVar34 = uVar34 + 2;
          } while (bVar77);
          goto LAB_001d0171;
        }
      }
    }
  }
  iVar1 = iVar21 * 2;
  lVar41 = 0;
  uVar34 = 0xfffffff4;
  do {
    auVar95._0_4_ = (float)(int)uVar34;
    auVar95._4_12_ = in_ZMM8._4_12_;
    auVar97._0_4_ = (float)(int)(uVar34 | 1);
    auVar97._4_12_ = in_ZMM8._4_12_;
    auVar79 = vfmadd213ss_fma(auVar95,auVar128._0_16_,ZEXT416((uint)fVar3));
    auVar80 = vfmadd213ss_fma(auVar97,auVar128._0_16_,ZEXT416((uint)fVar3));
    fVar93 = auVar79._0_4_;
    iVar72 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
    fVar93 = auVar80._0_4_;
    iVar74 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
    iVar15 = iVar1 + iVar72;
    iVar16 = iVar72 + -1;
    iVar17 = iVar72 + -1 + iVar21;
    iVar18 = iVar1 + iVar74;
    iVar19 = iVar74 + -1;
    iVar20 = iVar74 + -1 + iVar21;
    lVar40 = lVar41;
    iVar43 = -0xc;
    do {
      auVar96._0_4_ = (float)iVar43;
      auVar120 = auVar119._4_12_;
      auVar96._4_12_ = auVar120;
      auVar83 = auVar128._0_16_;
      auVar79 = vfmadd213ss_fma(auVar96,auVar83,auVar81);
      auVar116._0_4_ = (float)(iVar43 + 1);
      auVar116._4_12_ = auVar120;
      auVar80 = vfmadd213ss_fma(auVar116,auVar83,auVar81);
      auVar104._0_4_ = (float)(iVar43 + 2);
      auVar104._4_12_ = auVar120;
      auVar82 = vfmadd213ss_fma(auVar104,auVar83,auVar81);
      auVar101._0_4_ = (float)(iVar43 + 3);
      auVar101._4_12_ = auVar120;
      auVar83 = vfmadd213ss_fma(auVar101,auVar83,auVar81);
      fVar93 = auVar79._0_4_;
      fVar115 = auVar80._0_4_;
      fVar103 = auVar82._0_4_;
      fVar99 = auVar83._0_4_;
      pfVar68 = (float *)((long)haarResponseY + lVar40);
      iVar37 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
      if ((((iVar72 < 1) || (iVar37 < 1)) || (iimage->height < iVar15)) ||
         (iVar22 = iVar1 + iVar37, iimage->width < iVar22)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar37,iVar21,(float *)((long)haarResponseX + lVar40),pfVar68);
      }
      else {
        iVar25 = iVar37 + -1 + iVar21;
        pfVar69 = iimage->data;
        iVar23 = iimage->data_width;
        iVar24 = iVar23 * iVar16;
        fVar93 = pfVar69[iVar23 * iVar17 + -1 + iVar37];
        iVar26 = iVar23 * (iVar1 + -1 + iVar72);
        fVar100 = pfVar69[iVar26 + -1 + iVar37];
        fVar4 = pfVar69[iVar26 + -1 + iVar22];
        fVar5 = pfVar69[iVar24 + -1 + iVar37];
        fVar6 = pfVar69[iVar24 + -1 + iVar22];
        fVar7 = pfVar69[iVar23 * iVar17 + -1 + iVar22];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar69[iVar24 + iVar25] - pfVar69[iVar26 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *(float *)((long)haarResponseX + lVar40) = (fVar100 - fVar6) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *pfVar68 = auVar79._0_4_ - (fVar100 - fVar6);
      }
      iVar22 = (int)((double)((ulong)(0.0 <= fVar115) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar115) * -0x4020000000000000) + (double)fVar115);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 4);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 4);
      if (((iVar72 < 1) || (iVar22 < 1)) ||
         ((iimage->height < iVar15 || (iVar23 = iVar1 + iVar22, iimage->width < iVar23)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar22,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar26 = iVar22 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar24 = iimage->data_width;
        iVar25 = iVar24 * iVar16;
        fVar93 = pfVar59[iVar24 * iVar17 + -1 + iVar22];
        iVar27 = iVar24 * (iVar1 + -1 + iVar72);
        fVar115 = pfVar59[iVar27 + -1 + iVar22];
        fVar100 = pfVar59[iVar27 + -1 + iVar23];
        fVar4 = pfVar59[iVar25 + -1 + iVar22];
        fVar5 = pfVar59[iVar25 + -1 + iVar23];
        fVar6 = pfVar59[iVar24 * iVar17 + -1 + iVar23];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar26] - pfVar59[iVar27 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar100 - fVar4)));
        *pfVar68 = (fVar115 - fVar5) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar100 - fVar4)));
        *pfVar69 = auVar79._0_4_ - (fVar115 - fVar5);
      }
      iVar23 = (int)((double)((ulong)(0.0 <= fVar103) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar103) * -0x4020000000000000) + (double)fVar103);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 8);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 8);
      if (((iVar72 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar15 || (iVar24 = iVar1 + iVar23, iimage->width < iVar24)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar23,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar27 = iVar23 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar25 = iimage->data_width;
        iVar26 = iVar25 * iVar16;
        fVar93 = pfVar59[iVar25 * iVar17 + -1 + iVar23];
        iVar28 = iVar25 * (iVar1 + -1 + iVar72);
        fVar103 = pfVar59[iVar28 + -1 + iVar23];
        fVar115 = pfVar59[iVar28 + -1 + iVar24];
        fVar100 = pfVar59[iVar26 + -1 + iVar23];
        fVar4 = pfVar59[iVar26 + -1 + iVar24];
        fVar5 = pfVar59[iVar25 * iVar17 + -1 + iVar24];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar26 + iVar27] - pfVar59[iVar28 + iVar27]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar115 - fVar100)));
        *pfVar68 = (fVar103 - fVar4) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar115 - fVar100)));
        *pfVar69 = auVar79._0_4_ - (fVar103 - fVar4);
      }
      iVar24 = (int)((double)((ulong)(0.0 <= fVar99) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar99) * -0x4020000000000000) + (double)fVar99);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0xc);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0xc);
      if ((((iVar72 < 1) || (iVar24 < 1)) || (iimage->height < iVar15)) ||
         (iVar25 = iVar24 + iVar1, iimage->width < iVar25)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar24,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar28 = iVar24 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar26 = iimage->data_width;
        iVar27 = iVar26 * iVar16;
        fVar93 = pfVar59[iVar26 * iVar17 + -1 + iVar24];
        iVar29 = iVar26 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar29 + -1 + iVar24];
        fVar103 = pfVar59[iVar29 + -1 + iVar25];
        fVar115 = pfVar59[iVar27 + -1 + iVar24];
        fVar100 = pfVar59[iVar27 + -1 + iVar25];
        fVar4 = pfVar59[iVar26 * iVar17 + -1 + iVar25];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar27 + iVar28] - pfVar59[iVar29 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar91 = vpbroadcastd_avx512vl();
      auVar91 = vpaddd_avx2(auVar91,_DAT_00576740);
      auVar91 = vcvtdq2ps_avx(auVar91);
      auVar13._4_4_ = fVar2;
      auVar13._0_4_ = fVar2;
      auVar13._8_4_ = fVar2;
      auVar13._12_4_ = fVar2;
      auVar13._16_4_ = fVar2;
      auVar13._20_4_ = fVar2;
      auVar13._24_4_ = fVar2;
      auVar13._28_4_ = fVar2;
      auVar14._4_4_ = fVar94;
      auVar14._0_4_ = fVar94;
      auVar14._8_4_ = fVar94;
      auVar14._12_4_ = fVar94;
      auVar14._16_4_ = fVar94;
      auVar14._20_4_ = fVar94;
      auVar14._24_4_ = fVar94;
      auVar14._28_4_ = fVar94;
      auVar80 = vfmadd132ps_fma(auVar91,auVar13,auVar14);
      auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar35 = vcmpps_avx512vl(ZEXT1632(auVar80),_DAT_00576760,0xd);
      bVar77 = (bool)((byte)(uVar35 >> 7) & 1);
      iVar25 = (int)((double)((ulong)bVar77 * 0x3fe0000000000000 +
                             (ulong)!bVar77 * -0x4020000000000000) + (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x10);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x10);
      if (((iVar72 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar15 || (iVar26 = iVar25 + iVar1, iimage->width < iVar26)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar25,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar29 = iVar25 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar27 = iimage->data_width;
        iVar28 = iVar27 * iVar16;
        fVar93 = pfVar59[iVar27 * iVar17 + -1 + iVar25];
        iVar30 = iVar27 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar30 + -1 + iVar25];
        fVar103 = pfVar59[iVar30 + -1 + iVar26];
        fVar115 = pfVar59[iVar28 + -1 + iVar25];
        fVar100 = pfVar59[iVar28 + -1 + iVar26];
        fVar4 = pfVar59[iVar27 * iVar17 + -1 + iVar26];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar28 + iVar29] - pfVar59[iVar30 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      bVar78 = (byte)uVar35;
      auVar79 = vpermilpd_avx((undefined1  [16])0x0,1);
      iVar26 = (int)((double)((ulong)(bVar78 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x14);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x14);
      if (((iVar72 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar15 || (iVar27 = iVar1 + iVar26, iimage->width < iVar27)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar26,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar30 = iVar26 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar28 = iimage->data_width;
        iVar29 = iVar28 * iVar16;
        fVar93 = pfVar59[iVar28 * iVar17 + -1 + iVar26];
        iVar31 = iVar28 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar31 + -1 + iVar26];
        fVar103 = pfVar59[iVar31 + -1 + iVar27];
        fVar115 = pfVar59[iVar29 + -1 + iVar26];
        fVar100 = pfVar59[iVar29 + -1 + iVar27];
        fVar4 = pfVar59[iVar28 * iVar17 + -1 + iVar27];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar29 + iVar30] - pfVar59[iVar31 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar79 = vmovshdup_avx((undefined1  [16])0x0);
      iVar27 = (int)((double)((ulong)(bVar78 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x18);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x18);
      if ((((iVar72 < 1) || (iVar27 < 1)) || (iimage->height < iVar15)) ||
         (iVar28 = iVar27 + iVar1, iimage->width < iVar28)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar27,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar31 = iVar27 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar29 = iimage->data_width;
        iVar30 = iVar29 * iVar16;
        fVar93 = pfVar59[iVar29 * iVar17 + -1 + iVar27];
        iVar32 = iVar29 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar32 + -1 + iVar27];
        fVar103 = pfVar59[iVar32 + -1 + iVar28];
        fVar115 = pfVar59[iVar30 + -1 + iVar27];
        fVar100 = pfVar59[iVar30 + -1 + iVar28];
        fVar4 = pfVar59[iVar29 * iVar17 + -1 + iVar28];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar30 + iVar31] - pfVar59[iVar32 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      iVar28 = (int)((double)((ulong)(bVar78 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 4 & 1) * -0x4020000000000000) + 0.0);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x1c);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x1c);
      if (((iVar72 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar15 || (iVar29 = iVar28 + iVar1, iimage->width < iVar29)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar28,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar32 = iVar28 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar30 = iimage->data_width;
        iVar31 = iVar30 * iVar16;
        fVar93 = pfVar59[iVar30 * iVar17 + -1 + iVar28];
        iVar33 = iVar30 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar33 + -1 + iVar28];
        fVar103 = pfVar59[iVar33 + -1 + iVar29];
        fVar115 = pfVar59[iVar31 + -1 + iVar28];
        fVar100 = pfVar59[iVar31 + -1 + iVar29];
        fVar4 = pfVar59[iVar30 * iVar17 + -1 + iVar29];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar31 + iVar32] - pfVar59[iVar33 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar79 = vpermilps_avx(auVar80,0xff);
      iVar29 = (int)((double)((ulong)(bVar78 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x20);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x20);
      if (((iVar72 < 1) || (iVar29 < 1)) ||
         ((iimage->height < iVar15 || (iVar30 = iVar1 + iVar29, iimage->width < iVar30)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar29,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar33 = iVar29 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar31 = iimage->data_width;
        iVar32 = iVar31 * iVar16;
        fVar93 = pfVar59[iVar31 * iVar17 + -1 + iVar29];
        iVar56 = iVar31 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar56 + -1 + iVar29];
        fVar103 = pfVar59[iVar56 + -1 + iVar30];
        fVar115 = pfVar59[iVar32 + -1 + iVar29];
        fVar100 = pfVar59[iVar32 + -1 + iVar30];
        fVar4 = pfVar59[iVar31 * iVar17 + -1 + iVar30];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar32 + iVar33] - pfVar59[iVar56 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar79 = vpermilpd_avx(auVar80,1);
      iVar30 = (int)((double)((ulong)(bVar78 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x24);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x24);
      if ((((iVar72 < 1) || (iVar30 < 1)) || (iimage->height < iVar15)) ||
         (iVar31 = iVar1 + iVar30, iimage->width < iVar31)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar30,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar56 = iVar30 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar32 = iimage->data_width;
        iVar33 = iVar32 * iVar16;
        fVar93 = pfVar59[iVar32 * iVar17 + -1 + iVar30];
        iVar55 = iVar32 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar55 + -1 + iVar30];
        fVar103 = pfVar59[iVar55 + -1 + iVar31];
        fVar115 = pfVar59[iVar33 + -1 + iVar30];
        fVar100 = pfVar59[iVar33 + -1 + iVar31];
        fVar4 = pfVar59[iVar32 * iVar17 + -1 + iVar31];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar33 + iVar56] - pfVar59[iVar55 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar79 = vmovshdup_avx(auVar80);
      iVar31 = (int)((double)((ulong)(bVar78 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar79._0_4_);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x28);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x28);
      if (((iVar72 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar15 || (iVar32 = iVar1 + iVar31, iimage->width < iVar32)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar31,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar55 = iVar31 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar33 = iimage->data_width;
        iVar56 = iVar33 * iVar16;
        fVar93 = pfVar59[iVar33 * iVar17 + -1 + iVar31];
        iVar54 = iVar33 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar54 + -1 + iVar31];
        fVar103 = pfVar59[iVar54 + -1 + iVar32];
        fVar115 = pfVar59[iVar56 + -1 + iVar31];
        fVar100 = pfVar59[iVar56 + -1 + iVar32];
        fVar4 = pfVar59[iVar33 * iVar17 + -1 + iVar32];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar56 + iVar55] - pfVar59[iVar54 + iVar55]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      local_c8 = auVar80._0_4_;
      iVar32 = (int)((double)((ulong)(bVar78 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar78 & 1) * -0x4020000000000000) + (double)local_c8);
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x2c);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x2c);
      if (((iVar72 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar15 || (iVar33 = iVar1 + iVar32, iimage->width < iVar33)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar72,iVar32,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar54 = iVar32 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar56 = iimage->data_width;
        iVar55 = iVar56 * iVar16;
        fVar93 = pfVar59[iVar56 * iVar17 + -1 + iVar32];
        iVar53 = iVar56 * (iVar1 + -1 + iVar72);
        fVar99 = pfVar59[iVar53 + -1 + iVar32];
        fVar103 = pfVar59[iVar53 + -1 + iVar33];
        fVar115 = pfVar59[iVar55 + -1 + iVar32];
        fVar100 = pfVar59[iVar55 + -1 + iVar33];
        fVar4 = pfVar59[iVar56 * iVar17 + -1 + iVar33];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar55 + iVar54] - pfVar59[iVar53 + iVar54]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x60);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x60);
      if ((((iVar74 < 1) || (iVar37 < 1)) || (iimage->height < iVar18)) ||
         (iVar33 = iVar1 + iVar37, iimage->width < iVar33)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar37,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar55 = iVar37 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar56 = iimage->data_width;
        iVar53 = iVar56 * iVar19;
        fVar93 = pfVar59[iVar56 * iVar20 + -1 + iVar37];
        iVar54 = iVar56 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar54 + -1 + iVar37];
        fVar103 = pfVar59[iVar54 + -1 + iVar33];
        fVar115 = pfVar59[iVar53 + -1 + iVar37];
        fVar100 = pfVar59[iVar53 + -1 + iVar33];
        fVar4 = pfVar59[iVar56 * iVar20 + -1 + iVar33];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar53 + iVar55] - pfVar59[iVar54 + iVar55]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 100);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 100);
      if (((iVar74 < 1) || (iVar22 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar22, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar22,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar56 = iVar22 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar33 = iimage->data_width;
        iVar54 = iVar33 * iVar19;
        fVar93 = pfVar59[iVar33 * iVar20 + -1 + iVar22];
        iVar55 = iVar33 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar55 + -1 + iVar22];
        fVar103 = pfVar59[iVar55 + -1 + iVar37];
        fVar115 = pfVar59[iVar54 + -1 + iVar22];
        fVar100 = pfVar59[iVar54 + -1 + iVar37];
        fVar4 = pfVar59[iVar33 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar54 + iVar56] - pfVar59[iVar55 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x68);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x68);
      if (((iVar74 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar23, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar23,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar33 = iVar23 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar55 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar23];
        iVar56 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar56 + -1 + iVar23];
        fVar103 = pfVar59[iVar56 + -1 + iVar37];
        fVar115 = pfVar59[iVar55 + -1 + iVar23];
        fVar100 = pfVar59[iVar55 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar55 + iVar33] - pfVar59[iVar56 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x6c);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x6c);
      if ((((iVar74 < 1) || (iVar24 < 1)) || (iimage->height < iVar18)) ||
         (iVar37 = iVar24 + iVar1, iimage->width < iVar37)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar24,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar24 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar56 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar24];
        iVar33 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar33 + -1 + iVar24];
        fVar103 = pfVar59[iVar33 + -1 + iVar37];
        fVar115 = pfVar59[iVar56 + -1 + iVar24];
        fVar100 = pfVar59[iVar56 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar56 + iVar23] - pfVar59[iVar33 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x70);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x70);
      if (((iVar74 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar25 + iVar1, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar25,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar25 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar33 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar25];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar25];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar33 + -1 + iVar25];
        fVar100 = pfVar59[iVar33 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar33 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x74);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x74);
      if (((iVar74 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar26, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar26,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar26 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar26];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar26];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar26];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x78);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x78);
      if ((((iVar74 < 1) || (iVar27 < 1)) || (iimage->height < iVar18)) ||
         (iVar37 = iVar27 + iVar1, iimage->width < iVar37)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar27,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar27 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar27];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar27];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar27];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x7c);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x7c);
      if (((iVar74 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar28 + iVar1, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar28,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar28 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar28];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar28];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar28];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x80);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x80);
      if (((iVar74 < 1) || (iVar29 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar29, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar29,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar29 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar29];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar29];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar29];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x84);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x84);
      if ((((iVar74 < 1) || (iVar30 < 1)) || (iimage->height < iVar18)) ||
         (iVar37 = iVar1 + iVar30, iimage->width < iVar37)) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar30,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar30 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar30];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar30];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar30];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x88);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x88);
      if (((iVar74 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar31, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar31,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar31 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar31];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar31];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar31];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      pfVar68 = (float *)((long)haarResponseX + lVar40 + 0x8c);
      pfVar69 = (float *)((long)haarResponseY + lVar40 + 0x8c);
      if (((iVar74 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar18 || (iVar37 = iVar1 + iVar32, iimage->width < iVar37)))) {
        auVar119 = ZEXT1664(auVar119._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar32,iVar21,pfVar68,pfVar69);
      }
      else {
        iVar23 = iVar32 + -1 + iVar21;
        pfVar59 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar19;
        fVar93 = pfVar59[iVar22 * iVar20 + -1 + iVar32];
        iVar24 = iVar22 * (iVar1 + -1 + iVar74);
        fVar99 = pfVar59[iVar24 + -1 + iVar32];
        fVar103 = pfVar59[iVar24 + -1 + iVar37];
        fVar115 = pfVar59[iVar25 + -1 + iVar32];
        fVar100 = pfVar59[iVar25 + -1 + iVar37];
        fVar4 = pfVar59[iVar22 * iVar20 + -1 + iVar37];
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(pfVar59[iVar25 + iVar23] - pfVar59[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar68 = (fVar99 - fVar100) + auVar79._0_4_;
        auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar93 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar103 - fVar115)));
        *pfVar69 = auVar79._0_4_ - (fVar99 - fVar100);
      }
      auVar128 = ZEXT1664(ZEXT416((uint)fVar94));
      lVar40 = lVar40 + 0x30;
      bVar77 = iVar43 < 0;
      iVar43 = iVar43 + 0xc;
    } while (bVar77);
    lVar41 = lVar41 + 0xc0;
    bVar77 = (int)uVar34 < 10;
    uVar34 = uVar34 + 2;
  } while (bVar77);
LAB_001d0171:
  fVar94 = auVar128._0_4_;
  auVar127._8_4_ = 0x3effffff;
  auVar127._0_8_ = 0x3effffff3effffff;
  auVar127._12_4_ = 0x3effffff;
  auVar126._8_4_ = 0x80000000;
  auVar126._0_8_ = 0x8000000080000000;
  auVar126._12_4_ = 0x80000000;
  auVar79 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 0.5)),auVar126,0xf8);
  auVar79 = ZEXT416((uint)(fVar94 * 0.5 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  auVar80 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 1.5)),auVar126,0xf8);
  auVar80 = ZEXT416((uint)(fVar94 * 1.5 + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 2.5)),auVar126,0xf8);
  auVar81 = ZEXT416((uint)(fVar94 * 2.5 + auVar81._0_4_));
  auVar81 = vroundss_avx(auVar81,auVar81,0xb);
  auVar82 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 3.5)),auVar126,0xf8);
  auVar82 = ZEXT416((uint)(fVar94 * 3.5 + auVar82._0_4_));
  auVar82 = vroundss_avx(auVar82,auVar82,0xb);
  auVar83 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 4.5)),auVar126,0xf8);
  auVar83 = ZEXT416((uint)(fVar94 * 4.5 + auVar83._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  auVar84 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 5.5)),auVar126,0xf8);
  auVar84 = ZEXT416((uint)(fVar94 * 5.5 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 6.5)),auVar126,0xf8);
  auVar85 = ZEXT416((uint)(fVar94 * 6.5 + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar86 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 7.5)),auVar126,0xf8);
  auVar86 = ZEXT416((uint)(auVar86._0_4_ + fVar94 * 7.5));
  auVar86 = vroundss_avx(auVar86,auVar86,0xb);
  auVar87 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 8.5)),auVar126,0xf8);
  auVar87 = ZEXT416((uint)(fVar94 * 8.5 + auVar87._0_4_));
  auVar87 = vroundss_avx(auVar87,auVar87,0xb);
  auVar88 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 9.5)),auVar126,0xf8);
  auVar88 = ZEXT416((uint)(fVar94 * 9.5 + auVar88._0_4_));
  auVar88 = vroundss_avx(auVar88,auVar88,0xb);
  auVar89 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 10.5)),auVar126,0xf8);
  auVar89 = ZEXT416((uint)(fVar94 * 10.5 + auVar89._0_4_));
  auVar89 = vroundss_avx(auVar89,auVar89,0xb);
  auVar90 = vpternlogd_avx512vl(auVar127,ZEXT416((uint)(fVar94 * 11.5)),auVar126,0xf8);
  auVar90 = ZEXT416((uint)(fVar94 * 11.5 + auVar90._0_4_));
  auVar90 = vroundss_avx(auVar90,auVar90,0xb);
  fVar100 = auVar81._0_4_;
  fVar94 = fVar100 + auVar80._0_4_;
  fVar2 = fVar100 + auVar79._0_4_;
  fVar3 = fVar100 - auVar79._0_4_;
  fVar93 = fVar100 - auVar80._0_4_;
  fVar99 = fVar100 - auVar82._0_4_;
  fVar103 = fVar100 - auVar83._0_4_;
  fVar115 = fVar100 - auVar84._0_4_;
  fVar100 = fVar100 - auVar85._0_4_;
  fVar121 = auVar86._0_4_;
  fVar4 = fVar121 - auVar82._0_4_;
  fVar5 = fVar121 - auVar83._0_4_;
  fVar6 = fVar121 - auVar84._0_4_;
  fVar7 = fVar121 - auVar85._0_4_;
  fVar8 = fVar121 - auVar87._0_4_;
  fVar9 = fVar121 - auVar88._0_4_;
  fVar10 = fVar121 - auVar89._0_4_;
  fVar121 = fVar121 - auVar90._0_4_;
  gauss_s1_c0[0] = expf(fVar94 * fVar94 * fVar92);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar92);
  gauss_s1_c0[2] = expf(fVar3 * fVar3 * fVar92);
  gauss_s1_c0[3] = expf(fVar93 * fVar93 * fVar92);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar99 * fVar99 * fVar92);
  gauss_s1_c0[6] = expf(fVar103 * fVar103 * fVar92);
  gauss_s1_c0[7] = expf(fVar115 * fVar115 * fVar92);
  gauss_s1_c0[8] = expf(fVar100 * fVar100 * fVar92);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar92);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar92);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar92);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar92);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar92);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar92);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar92);
  gauss_s1_c1[8] = expf(fVar121 * fVar121 * fVar92);
  uVar35 = 0xfffffff8;
  lVar41 = 0;
  fVar94 = 0.0;
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  lVar40 = 0;
  lVar70 = 0;
  do {
    pfVar68 = gauss_s1_c1;
    uVar34 = (uint)uVar35;
    if (uVar34 != 7) {
      pfVar68 = gauss_s1_c0;
    }
    if (uVar34 == 0xfffffff8) {
      pfVar68 = gauss_s1_c1;
    }
    lVar40 = (long)(int)lVar40;
    iVar21 = (int)lVar70;
    lVar70 = (long)iVar21;
    lVar64 = (long)haarResponseX + lVar41;
    lVar42 = (long)haarResponseY + lVar41;
    uVar57 = 0xfffffff8;
    uVar44 = 0;
    do {
      pfVar69 = gauss_s1_c1;
      if (uVar57 != 7) {
        pfVar69 = gauss_s1_c0;
      }
      if (uVar57 == 0xfffffff8) {
        pfVar69 = gauss_s1_c1;
      }
      uVar36 = (ulong)(uVar57 >> 0x1c & 0xfffffff8);
      auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar39 = uVar44;
      lVar73 = lVar64;
      lVar75 = lVar42;
      do {
        lVar71 = 0;
        pfVar59 = (float *)((long)pfVar68 + (ulong)(uint)((int)(uVar35 >> 0x1f) << 5));
        do {
          fVar2 = pfVar69[uVar36] * *pfVar59;
          auVar79 = vinsertps_avx(ZEXT416(*(uint *)(lVar75 + lVar71 * 4)),
                                  ZEXT416(*(uint *)(lVar73 + lVar71 * 4)),0x10);
          auVar113._0_4_ = fVar2 * auVar79._0_4_;
          auVar113._4_4_ = fVar2 * auVar79._4_4_;
          auVar113._8_4_ = fVar2 * auVar79._8_4_;
          auVar113._12_4_ = fVar2 * auVar79._12_4_;
          auVar79 = vandps_avx(auVar113,auVar98);
          auVar79 = vmovlhps_avx(auVar113,auVar79);
          auVar102._0_4_ = auVar119._0_4_ + auVar79._0_4_;
          auVar102._4_4_ = auVar119._4_4_ + auVar79._4_4_;
          auVar102._8_4_ = auVar119._8_4_ + auVar79._8_4_;
          auVar102._12_4_ = auVar119._12_4_ + auVar79._12_4_;
          auVar119 = ZEXT1664(auVar102);
          pfVar59 = pfVar59 + (ulong)(~uVar34 >> 0x1f) * 2 + -1;
          lVar71 = lVar71 + 1;
        } while (lVar71 != 9);
        uVar39 = uVar39 + 0x18;
        uVar36 = uVar36 + (ulong)(-1 < (int)uVar57) * 2 + -1;
        lVar73 = lVar73 + 0x60;
        lVar75 = lVar75 + 0x60;
      } while (uVar39 < uVar57 * 0x18 + 0x198);
      fVar2 = gauss_s2_arr[lVar70];
      auVar12._4_4_ = fVar2;
      auVar12._0_4_ = fVar2;
      auVar12._8_4_ = fVar2;
      auVar12._12_4_ = fVar2;
      auVar81 = vmulps_avx512vl(auVar102,auVar12);
      lVar70 = lVar70 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar40) = auVar81;
      auVar105._0_4_ = auVar81._0_4_ * auVar81._0_4_;
      auVar105._4_4_ = auVar81._4_4_ * auVar81._4_4_;
      auVar105._8_4_ = auVar81._8_4_ * auVar81._8_4_;
      auVar105._12_4_ = auVar81._12_4_ * auVar81._12_4_;
      auVar79 = vmovshdup_avx(auVar105);
      auVar80 = vfmadd231ss_fma(auVar79,auVar81,auVar81);
      auVar79 = vshufpd_avx(auVar81,auVar81,1);
      auVar80 = vfmadd213ss_fma(auVar79,auVar79,auVar80);
      auVar79 = vshufps_avx(auVar81,auVar81,0xff);
      auVar79 = vfmadd213ss_fma(auVar79,auVar79,auVar80);
      fVar94 = fVar94 + auVar79._0_4_;
      lVar40 = lVar40 + 4;
      uVar57 = uVar57 + 5;
      uVar44 = uVar44 + 0x78;
      lVar64 = lVar64 + 0x1e0;
      lVar42 = lVar42 + 0x1e0;
    } while (iVar21 + 4 != (int)lVar70);
    lVar41 = lVar41 + 0x14;
    uVar35 = (ulong)(uVar34 + 5);
  } while ((int)uVar34 < 3);
  if (fVar94 < 0.0) {
    fVar94 = sqrtf(fVar94);
  }
  else {
    auVar79 = vsqrtss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94));
    fVar94 = auVar79._0_4_;
  }
  auVar119 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar94)));
  lVar41 = 0;
  do {
    auVar123 = vmulps_avx512f(auVar119,*(undefined1 (*) [64])(ipoint->descriptor + lVar41));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar41) = auVar123;
    lVar41 = lVar41 + 0x10;
  } while (lVar41 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}